

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O3

int tnt_buf_reply(tnt_stream *s,tnt_reply *r)

{
  long *plVar1;
  int iVar2;
  size_t size;
  size_t local_18;
  size_t off;
  
  plVar1 = (long *)s->data;
  if (*plVar1 == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 1;
    size = plVar1[1] - plVar1[3];
    if (size != 0) {
      local_18 = 0;
      iVar2 = tnt_reply(r,(char *)(*plVar1 + plVar1[3]),size,&local_18);
      if (iVar2 == 0) {
        plVar1[3] = plVar1[3] + local_18;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
tnt_buf_reply(struct tnt_stream *s, struct tnt_reply *r) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->data == NULL)
		return -1;
	if (sb->size == sb->rdoff)
		return 1;
	size_t off = 0;
	int rc = tnt_reply(r, sb->data + sb->rdoff, sb->size - sb->rdoff, &off);
	if (rc == 0)
		sb->rdoff += off;
	return rc;
}